

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 google::protobuf::internal::ArenaImpl::SerialArena::Free
                 (SerialArena *serial,Block *initial_block,_func_void_void_ptr_size_t *block_dealloc
                 )

{
  Block *pBVar1;
  size_t sVar2;
  code *in_RDX;
  Block *in_RSI;
  long in_RDI;
  Block *next_block;
  Block *b;
  uint64 space_allocated;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = 0;
  pBVar1 = *(Block **)(in_RDI + 0x10);
  while (local_28 = pBVar1, local_28 != (Block *)0x0) {
    pBVar1 = Block::next(local_28);
    sVar2 = Block::size(local_28);
    local_20 = sVar2 + local_20;
    if (local_28 != in_RSI) {
      sVar2 = Block::size(local_28);
      (*in_RDX)(local_28,sVar2);
    }
  }
  return local_20;
}

Assistant:

uint64 ArenaImpl::SerialArena::Free(ArenaImpl::SerialArena* serial,
                                    Block* initial_block,
                                    void (*block_dealloc)(void*, size_t)) {
  uint64 space_allocated = 0;

  // We have to be careful in this function, since we will be freeing the Block
  // that contains this SerialArena.  Be careful about accessing |serial|.

  for (Block* b = serial->head_; b;) {
    // This is inside the block we are freeing, so we need to read it now.
    Block* next_block = b->next();
    space_allocated += (b->size());

#ifdef ADDRESS_SANITIZER
    // This memory was provided by the underlying allocator as unpoisoned, so
    // return it in an unpoisoned state.
    ASAN_UNPOISON_MEMORY_REGION(b->Pointer(0), b->size());
#endif  // ADDRESS_SANITIZER

    if (b != initial_block) {
      block_dealloc(b, b->size());
    }

    b = next_block;
  }

  return space_allocated;
}